

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

int mbedtls_rsa_rsaes_pkcs1_v15_decrypt
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,size_t *olen,uchar *input,uchar *output,size_t output_max_len)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  uchar *__n;
  size_t sVar5;
  uint uVar6;
  size_t sVar7;
  undefined8 uStack_420;
  uchar local_418;
  byte local_417;
  uchar local_416 [1030];
  
  if (mode == 1) {
    if (ctx->padding != 0) {
      return -0x4080;
    }
    sVar7 = ctx->len;
    if (sVar7 - 0x401 < 0xfffffffffffffc0f) {
      return -0x4080;
    }
    uStack_420 = 0x11c53e;
    iVar2 = mbedtls_rsa_private(ctx,f_rng,p_rng,input,&local_418);
    if (iVar2 != 0) goto LAB_0011c653;
    local_417 = local_417 ^ 2;
    uVar6 = 0;
    sVar5 = 3;
    uVar4 = 0;
    do {
      uVar6 = *(char *)((long)&uStack_420 + sVar5 + 7) == '\0' | uVar6;
      uVar4 = uVar4 + ((-uVar6 & 0xff) >> 7 ^ 1);
      sVar5 = sVar5 + 1;
    } while (sVar7 != sVar5);
  }
  else {
    sVar7 = ctx->len;
    if (sVar7 - 0x401 < 0xfffffffffffffc0f) {
      return -0x4080;
    }
    if (mode == 0) {
      uStack_420 = 0x11c5cb;
      iVar2 = mbedtls_rsa_public(ctx,input,&local_418);
    }
    else {
      uStack_420 = 0x11c5be;
      iVar2 = mbedtls_rsa_private(ctx,f_rng,p_rng,input,&local_418);
    }
    if (iVar2 != 0) goto LAB_0011c653;
    local_417 = local_417 ^ 1;
    bVar1 = false;
    sVar5 = 3;
    uVar4 = 0;
    do {
      bVar1 = (bool)(bVar1 | *(char *)((long)&uStack_420 + sVar5 + 7) != -1);
      uVar4 = uVar4 + !bVar1;
      sVar5 = sVar5 + 1;
    } while (sVar7 != sVar5);
  }
  iVar2 = -0x4100;
  if (7 < uVar4 && ((local_417 == 0 && local_416[uVar4] == '\0') && local_418 == '\0')) {
    __n = &local_418 + (sVar7 - (long)(local_416 + uVar4 + 1));
    iVar2 = -0x4400;
    if (__n <= output_max_len) {
      *olen = (size_t)__n;
      uStack_420 = 0x11c651;
      memcpy(output,local_416 + uVar4 + 1,(size_t)__n);
      iVar2 = 0;
    }
  }
LAB_0011c653:
  lVar3 = 0;
  do {
    (&local_418)[lVar3] = '\0';
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x400);
  return iVar2;
}

Assistant:

int mbedtls_rsa_rsaes_pkcs1_v15_decrypt( mbedtls_rsa_context *ctx,
                                 int (*f_rng)(void *, unsigned char *, size_t),
                                 void *p_rng,
                                 int mode, size_t *olen,
                                 const unsigned char *input,
                                 unsigned char *output,
                                 size_t output_max_len)
{
    int ret;
    size_t ilen, pad_count = 0, i;
    unsigned char *p, bad, pad_done = 0;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V15 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    ilen = ctx->len;

    if( ilen < 16 || ilen > sizeof( buf ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    ret = ( mode == MBEDTLS_RSA_PUBLIC )
          ? mbedtls_rsa_public(  ctx, input, buf )
          : mbedtls_rsa_private( ctx, f_rng, p_rng, input, buf );

    if( ret != 0 )
        goto cleanup;

    p = buf;
    bad = 0;

    /*
     * Check and get padding len in "constant-time"
     */
    bad |= *p++; /* First byte must be 0 */

    /* This test does not depend on secret data */
    if( mode == MBEDTLS_RSA_PRIVATE )
    {
        bad |= *p++ ^ MBEDTLS_RSA_CRYPT;

        /* Get padding len, but always read till end of buffer
         * (minus one, for the 00 byte) */
        for( i = 0; i < ilen - 3; i++ )
        {
            pad_done  |= ((p[i] | (unsigned char)-p[i]) >> 7) ^ 1;
            pad_count += ((pad_done | (unsigned char)-pad_done) >> 7) ^ 1;
        }

        p += pad_count;
        bad |= *p++; /* Must be zero */
    }
    else
    {
        bad |= *p++ ^ MBEDTLS_RSA_SIGN;

        /* Get padding len, but always read till end of buffer
         * (minus one, for the 00 byte) */
        for( i = 0; i < ilen - 3; i++ )
        {
            pad_done |= ( p[i] != 0xFF );
            pad_count += ( pad_done == 0 );
        }

        p += pad_count;
        bad |= *p++; /* Must be zero */
    }

    bad |= ( pad_count < 8 );

    if( bad )
    {
        ret = MBEDTLS_ERR_RSA_INVALID_PADDING;
        goto cleanup;
    }

    if( ilen - ( p - buf ) > output_max_len )
    {
        ret = MBEDTLS_ERR_RSA_OUTPUT_TOO_LARGE;
        goto cleanup;
    }

    *olen = ilen - (p - buf);
    memcpy( output, p, *olen );
    ret = 0;

cleanup:
    mbedtls_zeroize( buf, sizeof( buf ) );

    return( ret );
}